

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

bool kratos::is_reduction_op(ExprOp op)

{
  initializer_list<kratos::ExprOp> __l;
  bool bVar1;
  int iVar2;
  _Node_iterator_base<kratos::ExprOp,_false> local_70;
  _Node_iterator_base<kratos::ExprOp,_false> local_68 [3];
  allocator<kratos::ExprOp> local_4b;
  key_equal local_4a;
  hasher local_49;
  ExprOp local_48 [5];
  iterator local_20;
  size_type local_18;
  ExprOp local_10;
  ExprOp op_local;
  
  local_10 = op;
  if (is_reduction_op(kratos::ExprOp)::ops == '\0') {
    iVar2 = __cxa_guard_acquire(&is_reduction_op(kratos::ExprOp)::ops);
    if (iVar2 != 0) {
      local_48[2] = 5;
      local_48[3] = 4;
      local_48[0] = UOr;
      local_48[1] = 6;
      local_20 = local_48;
      local_18 = 4;
      std::allocator<kratos::ExprOp>::allocator(&local_4b);
      __l._M_len = local_18;
      __l._M_array = local_20;
      std::
      unordered_set<kratos::ExprOp,_std::hash<kratos::ExprOp>,_std::equal_to<kratos::ExprOp>,_std::allocator<kratos::ExprOp>_>
      ::unordered_set(&is_reduction_op::ops,__l,0,&local_49,&local_4a,&local_4b);
      std::allocator<kratos::ExprOp>::~allocator(&local_4b);
      __cxa_atexit(std::
                   unordered_set<kratos::ExprOp,_std::hash<kratos::ExprOp>,_std::equal_to<kratos::ExprOp>,_std::allocator<kratos::ExprOp>_>
                   ::~unordered_set,&is_reduction_op::ops,&__dso_handle);
      __cxa_guard_release(&is_reduction_op(kratos::ExprOp)::ops);
    }
  }
  local_68[0]._M_cur =
       (__node_type *)
       std::
       unordered_set<kratos::ExprOp,_std::hash<kratos::ExprOp>,_std::equal_to<kratos::ExprOp>,_std::allocator<kratos::ExprOp>_>
       ::find(&is_reduction_op::ops,&local_10);
  local_70._M_cur =
       (__node_type *)
       std::
       unordered_set<kratos::ExprOp,_std::hash<kratos::ExprOp>,_std::equal_to<kratos::ExprOp>,_std::allocator<kratos::ExprOp>_>
       ::end(&is_reduction_op::ops);
  bVar1 = std::__detail::operator!=(local_68,&local_70);
  return bVar1;
}

Assistant:

bool is_reduction_op(ExprOp op) {
    static std::unordered_set<ExprOp> ops = {ExprOp::UOr, ExprOp::UXor, ExprOp::UAnd, ExprOp::UNot};
    return ops.find(op) != ops.end();
}